

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O1

bool __thiscall S2Loop::Contains(S2Loop *this,S2Point *p)

{
  atomic<int> *paVar1;
  int iVar2;
  bool bVar3;
  const_iterator cVar4;
  Iterator local_60;
  
  if (((this->index_).index_status_._M_i == FRESH) ||
     (bVar3 = S2LatLngRect::Contains(&this->bound_,p), bVar3)) {
    if (((int)((ulong)((long)(this->index_).shapes_.
                             super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->index_).shapes_.
                            super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) == 0) ||
       (this->num_vertices_ < 0x21)) {
LAB_001fe698:
      bVar3 = BruteForceContains(this,p);
      return bVar3;
    }
    if ((this->index_).index_status_._M_i != FRESH) {
      LOCK();
      paVar1 = &this->unindexed_contains_calls_;
      iVar2 = (paVar1->super___atomic_base<int>)._M_i;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      if (iVar2 != 0x13) goto LAB_001fe698;
    }
    local_60.super_IteratorBase.id_.id_ = 0xffffffffffffffff;
    local_60.super_IteratorBase.cell_._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_60.super_IteratorBase._vptr_IteratorBase = (_func_int **)&PTR__IteratorBase_002c10d0;
    local_60.iter_.node =
         (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
          *)0x0;
    local_60.iter_.position = -1;
    local_60.end_.node =
         (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
          *)0x0;
    local_60.end_.position = -1;
    if ((this->index_).index_status_._M_i != FRESH) {
      MutableS2ShapeIndex::ApplyUpdatesThreadSafe(&this->index_);
    }
    local_60.index_ = &this->index_;
    cVar4 = gtl::internal_btree::
            btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
            ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                   *)&(this->index_).cell_map_);
    local_60.iter_.node = cVar4.node;
    local_60.iter_.position = cVar4.position;
    local_60.super_IteratorBase.id_.id_ = 0xffffffffffffffff;
    local_60.super_IteratorBase.cell_._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_60.end_.node = local_60.iter_.node;
    local_60.end_.position = local_60.iter_.position;
    bVar3 = MutableS2ShapeIndex::Iterator::Locate(&local_60,p);
    if (bVar3) {
      bVar3 = Contains(this,&local_60,p);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool S2Loop::Contains(const S2Point& p) const {
  // NOTE(ericv): A bounds check slows down this function by about 50%.  It is
  // worthwhile only when it might allow us to delay building the index.
  if (!index_.is_fresh() && !bound_.Contains(p)) return false;

  // For small loops it is faster to just check all the crossings.  We also
  // use this method during loop initialization because InitOriginAndBound()
  // calls Contains() before InitIndex().  Otherwise, we keep track of the
  // number of calls to Contains() and only build the index when enough calls
  // have been made so that we think it is worth the effort.  Note that the
  // code below is structured so that if many calls are made in parallel only
  // one thread builds the index, while the rest continue using brute force
  // until the index is actually available.
  //
  // The constants below were tuned using the benchmarks.  It turns out that
  // building the index costs roughly 50x as much as Contains().  (The ratio
  // increases slowly from 46x with 64 points to 61x with 256k points.)  The
  // textbook approach to this problem would be to wait until the cumulative
  // time we would have saved with an index approximately equals the cost of
  // building the index, and then build it.  (This gives the optimal
  // competitive ratio of 2; look up "competitive algorithms" for details.)
  // We set the limit somewhat lower than this (20 rather than 50) because
  // building the index may be forced anyway by other API calls, and so we
  // want to err on the side of building it too early.

  static const int kMaxBruteForceVertices = 32;
  static const int kMaxUnindexedContainsCalls = 20;  // See notes above.
  if (index_.num_shape_ids() == 0 ||  // InitIndex() not called yet
      num_vertices() <= kMaxBruteForceVertices ||
      (!index_.is_fresh() &&
       ++unindexed_contains_calls_ != kMaxUnindexedContainsCalls)) {
    return BruteForceContains(p);
  }
  // Otherwise we look up the S2ShapeIndex cell containing this point.  Note
  // the index is built automatically the first time an iterator is created.
  MutableS2ShapeIndex::Iterator it(&index_);
  if (!it.Locate(p)) return false;
  return Contains(it, p);
}